

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void check_input(void *input_buffer,void *output_buffer,long frame_count)

{
  int line;
  String *this;
  char *message;
  AssertionResult gtest_ar;
  String local_50;
  long frame_count_local;
  AssertHelper local_30;
  void *output_buffer_local;
  
  local_50.c_str_ = (char *)0x0;
  frame_count_local = frame_count;
  output_buffer_local = output_buffer;
  testing::internal::CmpHelperEQ<void*,decltype(nullptr)>
            ((internal *)&gtest_ar,"output_buffer","nullptr",&output_buffer_local,&local_50.c_str_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x253;
LAB_00109430:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,line,message);
    this = &local_50;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)this);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_50.c_str_ = (char *)CONCAT44(local_50.c_str_._4_4_,0x100);
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar,"frame_count","256",&frame_count_local,(int *)&local_50);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x254;
      goto LAB_00109430;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar.success_ = input_buffer != (void *)0x0;
    if (gtest_ar.success_) goto LAB_00109455;
    this = (String *)&stack0xffffffffffffffc0;
    testing::Message::Message((Message *)this);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_50,&gtest_ar,"!!input_buffer","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x255,local_50.c_str_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)this);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::String::~String(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this);
LAB_00109455:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void check_input(const void * input_buffer, void * output_buffer, long frame_count)
{
  ASSERT_EQ(output_buffer, nullptr);
  ASSERT_EQ(frame_count, 256);
  ASSERT_TRUE(!!input_buffer);
}